

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CETime.cpp
# Opt level: O2

void __thiscall test_CETime::test_CETime(test_CETime *this)

{
  double local_48;
  CETime local_40;
  
  CETestSuite::CETestSuite(&this->super_CETestSuite);
  *(undefined ***)this = &PTR__test_CETime_00140588;
  CETime::CETime(&this->base_);
  local_48 = 123456.789;
  CETime::CETime(&local_40,&local_48,UTC);
  CETime::operator=(&this->base_,&local_40);
  CETime::~CETime(&local_40);
  local_48 = (double)CONCAT44(local_48._4_4_,500);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_40,(int *)&local_48);
  (this->naptime_).__r = (rep)local_40._vptr_CETime;
  local_40._vptr_CETime = (_func_int **)0x3da5fd7fe1796495;
  (**(code **)(*(long *)this + 0x30))(this,&local_40);
  return;
}

Assistant:

test_CETime::test_CETime() :
    CETestSuite()
{
    // Create the base objects for comparison
    base_    = CETime(123456.789, CETimeType::UTC);
    naptime_ = std::chrono::milliseconds(500);

    SetDblTol(1e-11);
    // pause execution to give the the date time to run
    //std::this_thread::sleep_for(naptime_);
}